

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,CappedArray<char,_5UL> *first,ArrayPtr<const_char> *rest,
                 CappedArray<char,_5UL> *rest_1,ArrayPtr<const_char> *rest_2,
                 CappedArray<char,_5UL> *rest_3,ArrayPtr<const_char> *rest_4,
                 ArrayPtr<const_char> *rest_5)

{
  size_t __n;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  __n = first->currentSize;
  if (__n != 0) {
    memcpy(target,first->content,__n);
    target = target + __n;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    pcVar2 = rest->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  pcVar2 = fill<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (target,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}